

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_add.c
# Opt level: O2

int linkedlist_add(s_linkedlist *linked_list,uint index,void *element)

{
  s_linkedlist_node *psVar1;
  int iVar2;
  s_linkedlist_node *psVar3;
  int iVar4;
  s_linkedlist_node *psVar5;
  
  if (index == 0) {
    iVar2 = linkedlist_add_front(linked_list,element);
    return iVar2;
  }
  iVar4 = index + 1;
  iVar2 = -1;
  psVar5 = (s_linkedlist_node *)linked_list;
  do {
    psVar5 = psVar5->next;
    if (psVar5 == (s_linkedlist_node *)0x0) {
      return -1;
    }
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  psVar3 = (s_linkedlist_node *)calloc(1,0x18);
  if (psVar3 != (s_linkedlist_node *)0x0) {
    psVar3->element = element;
    psVar1 = psVar5->previous;
    psVar3->previous = psVar1;
    psVar3->next = psVar5;
    if (psVar1 != (s_linkedlist_node *)0x0) {
      psVar1->next = psVar3;
    }
    psVar5->previous = psVar3;
    linked_list->size = linked_list->size + 1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int linkedlist_add(s_linkedlist *linked_list, unsigned int index, void *element) {
    s_linkedlist_node *node = linked_list->head;

    if (index == 0) {
        return linkedlist_add_front(linked_list, element);
    } else {
        while (node != NULL) {
            if (index == 0) {
                s_linkedlist_node *node_to_insert = malloc(sizeof(s_linkedlist_node));
                if (node_to_insert == NULL) {
                    return (LINKEDLIST_RETVAL_FAILURE);
                }

                memset(node_to_insert, 0, sizeof(s_linkedlist_node));

                node_to_insert->element  = element;
                node_to_insert->previous = node->previous;
                node_to_insert->next     = node;
                if (node->previous != NULL) {
                    node->previous->next = node_to_insert;
                }
                node->previous           = node_to_insert;

                linked_list->size += 1;
                return (LINKEDLIST_RETVAL_SUCCESS);
            }

            index -= 1;
            node = node->next;
        }
    }

    return (LINKEDLIST_RETVAL_FAILURE);
}